

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_intersect.h
# Opt level: O0

result crnlib::intersection::
       ray_aabb<crnlib::vec<3u,float>,float,crnlib::ray<crnlib::vec<3u,float>>,crnlib::vec_interval<crnlib::vec<3u,float>>>
                 (vec<3U,_float> *coord,float *t,ray<crnlib::vec<3U,_float>_> *ray,
                 vec_interval<crnlib::vec<3U,_float>_> *box)

{
  bool bVar1;
  vec<3U,_float> *pvVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint local_6c;
  int local_68;
  int i_3;
  int i_2;
  int which_plane;
  int i_1;
  float max_t [3];
  int i;
  float candidate_plane [3];
  int quadrant [3];
  bool inside;
  vec_interval<crnlib::vec<3U,_float>_> *box_local;
  ray<crnlib::vec<3U,_float>_> *ray_local;
  float *t_local;
  vec<3U,_float> *coord_local;
  
  bVar1 = true;
  for (max_t[1] = 0.0; (int)max_t[1] < 3; max_t[1] = (float)((int)max_t[1] + 1)) {
    pvVar2 = ray<crnlib::vec<3U,_float>_>::get_origin(ray);
    fVar4 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
    pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,0);
    fVar5 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
    if (fVar5 <= fVar4) {
      pvVar2 = ray<crnlib::vec<3U,_float>_>::get_origin(ray);
      fVar4 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
      pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,1);
      fVar5 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
      if (fVar4 <= fVar5) {
        candidate_plane[(long)(int)max_t[1] + 1] = 2.8026e-45;
      }
      else {
        candidate_plane[(long)(int)max_t[1] + 1] = 0.0;
        pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,1);
        fVar4 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
        max_t[(long)(int)max_t[1] + 2] = fVar4;
        bVar1 = false;
      }
    }
    else {
      candidate_plane[(long)(int)max_t[1] + 1] = 1.4013e-45;
      pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,0);
      fVar4 = vec<3U,_float>::operator[](pvVar2,(uint)max_t[1]);
      max_t[(long)(int)max_t[1] + 2] = fVar4;
      bVar1 = false;
    }
  }
  if (bVar1) {
    pvVar2 = ray<crnlib::vec<3U,_float>_>::get_origin(ray);
    vec<3U,_float>::operator=(coord,pvVar2);
    *t = 0.0;
    coord_local._4_4_ = cInside;
  }
  else {
    for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
      if (candidate_plane[(long)i_2 + 1] == 2.8026e-45) {
LAB_001c8c12:
        (&which_plane)[i_2] = -0x40800000;
      }
      else {
        pvVar2 = ray<crnlib::vec<3U,_float>_>::get_direction(ray);
        fVar4 = vec<3U,_float>::operator[](pvVar2,i_2);
        if ((fVar4 == 0.0) && (!NAN(fVar4))) goto LAB_001c8c12;
        fVar4 = max_t[(long)i_2 + 2];
        pvVar2 = ray<crnlib::vec<3U,_float>_>::get_origin(ray);
        fVar5 = vec<3U,_float>::operator[](pvVar2,i_2);
        pvVar2 = ray<crnlib::vec<3U,_float>_>::get_direction(ray);
        fVar6 = vec<3U,_float>::operator[](pvVar2,i_2);
        (&which_plane)[i_2] = (int)((fVar4 - fVar5) / fVar6);
      }
    }
    i_3 = 0;
    for (local_68 = 1; local_68 < 3; local_68 = local_68 + 1) {
      if ((float)(&which_plane)[i_3] < (float)(&which_plane)[local_68]) {
        i_3 = local_68;
      }
    }
    if (0.0 < (float)(&which_plane)[i_3] || (float)(&which_plane)[i_3] == 0.0) {
      for (local_6c = 0; (int)local_6c < 3; local_6c = local_6c + 1) {
        if (local_6c == i_3) {
          fVar4 = max_t[(long)(int)local_6c + 2];
          pfVar3 = vec<3U,_float>::operator[](coord,local_6c);
          *pfVar3 = fVar4;
        }
        else {
          pvVar2 = ray<crnlib::vec<3U,_float>_>::get_origin(ray);
          fVar5 = vec<3U,_float>::operator[](pvVar2,local_6c);
          fVar4 = (float)(&which_plane)[i_3];
          pvVar2 = ray<crnlib::vec<3U,_float>_>::get_direction(ray);
          fVar6 = vec<3U,_float>::operator[](pvVar2,local_6c);
          pfVar3 = vec<3U,_float>::operator[](coord,local_6c);
          *pfVar3 = fVar4 * fVar6 + fVar5;
          pfVar3 = vec<3U,_float>::operator[](coord,local_6c);
          fVar4 = *pfVar3;
          pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,0);
          fVar5 = vec<3U,_float>::operator[](pvVar2,local_6c);
          if (fVar4 < fVar5) {
            return cFailure;
          }
          pfVar3 = vec<3U,_float>::operator[](coord,local_6c);
          fVar4 = *pfVar3;
          pvVar2 = vec_interval<crnlib::vec<3U,_float>_>::operator[](box,1);
          fVar5 = vec<3U,_float>::operator[](pvVar2,local_6c);
          if (fVar5 < fVar4) {
            return cFailure;
          }
        }
      }
      *t = (float)(&which_plane)[i_3];
      coord_local._4_4_ = cSuccess;
    }
    else {
      coord_local._4_4_ = cFailure;
    }
  }
  return coord_local._4_4_;
}

Assistant:

result ray_aabb(vector_type& coord, scalar_type& t, const ray_type& ray, const aabb_type& box)
        {
            enum
            {
                cNumDim = vector_type::num_elements,
                cRight = 0,
                cLeft = 1,
                cMiddle = 2
            };

            bool inside = true;
            int quadrant[cNumDim];
            scalar_type candidate_plane[cNumDim];

            for (int i = 0; i < cNumDim; i++)
            {
                if (ray.get_origin()[i] < box[0][i])
                {
                    quadrant[i] = cLeft;
                    candidate_plane[i] = box[0][i];
                    inside = false;
                }
                else if (ray.get_origin()[i] > box[1][i])
                {
                    quadrant[i] = cRight;
                    candidate_plane[i] = box[1][i];
                    inside = false;
                }
                else
                {
                    quadrant[i] = cMiddle;
                }
            }

            if (inside)
            {
                coord = ray.get_origin();
                t = 0.0f;
                return cInside;
            }

            scalar_type max_t[cNumDim];
            for (int i = 0; i < cNumDim; i++)
            {
                if ((quadrant[i] != cMiddle) && (ray.get_direction()[i] != 0.0f))
                {
                    max_t[i] = (candidate_plane[i] - ray.get_origin()[i]) / ray.get_direction()[i];
                }
                else
                {
                    max_t[i] = -1.0f;
                }
            }

            int which_plane = 0;
            for (int i = 1; i < cNumDim; i++)
            {
                if (max_t[which_plane] < max_t[i])
                {
                    which_plane = i;
                }
            }
            if (max_t[which_plane] < 0.0f)
            {
                return cFailure;
            }

            for (int i = 0; i < cNumDim; i++)
            {
                if (i != which_plane)
                {
                    coord[i] = ray.get_origin()[i] + max_t[which_plane] * ray.get_direction()[i];

                    if ((coord[i] < box[0][i]) || (coord[i] > box[1][i]))
                    {
                        return cFailure;
                    }
                }
                else
                {
                    coord[i] = candidate_plane[i];
                }

                CRNLIB_ASSERT(coord[i] >= box[0][i] && coord[i] <= box[1][i]);
            }

            t = max_t[which_plane];
            return cSuccess;
        }